

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dual_Resampler.cpp
# Opt level: O1

void __thiscall
Dual_Resampler::dual_play(Dual_Resampler *this,long count,dsample_t *out,Blip_Buffer *blip_buf)

{
  int iVar1;
  long lVar2;
  
  iVar1 = this->buf_pos;
  if (this->sample_buf_size != iVar1) {
    lVar2 = (long)(this->sample_buf_size - iVar1);
    if (count <= lVar2) {
      lVar2 = count;
    }
    count = count - lVar2;
    memcpy(out,(this->sample_buf).begin_ + iVar1,lVar2 * 2);
    out = out + lVar2;
    this->buf_pos = this->buf_pos + (int)lVar2;
  }
  lVar2 = (long)this->sample_buf_size;
  for (; lVar2 <= count; count = count - lVar2) {
    play_frame_(this,blip_buf,out);
    lVar2 = (long)this->sample_buf_size;
    out = out + lVar2;
  }
  if (count != 0) {
    play_frame_(this,blip_buf,(this->sample_buf).begin_);
    this->buf_pos = (int)count;
    memcpy(out,(this->sample_buf).begin_,count * 2);
    return;
  }
  return;
}

Assistant:

void Dual_Resampler::dual_play( long count, dsample_t* out, Blip_Buffer& blip_buf )
{
	// empty extra buffer
	long remain = sample_buf_size - buf_pos;
	if ( remain )
	{
		if ( remain > count )
			remain = count;
		count -= remain;
		memcpy( out, &sample_buf [buf_pos], remain * sizeof *out );
		out += remain;
		buf_pos += remain;
	}
	
	// entire frames
	while ( count >= (long) sample_buf_size )
	{
		play_frame_( blip_buf, out );
		out += sample_buf_size;
		count -= sample_buf_size;
	}
	
	// extra
	if ( count )
	{
		play_frame_( blip_buf, sample_buf.begin() );
		buf_pos = count;
		memcpy( out, sample_buf.begin(), count * sizeof *out );
		out += count;
	}
}